

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O0

bool __thiscall json::SaveObject::process<bool>(SaveObject *this,char *name,bool *t)

{
  ostream *poVar1;
  ulong uVar2;
  int local_2c;
  int i;
  bool *t_local;
  char *name_local;
  SaveObject *this_local;
  
  if ((this->first & 1U) == 0) {
    std::operator<<(this->out,",\n");
  }
  else {
    this->first = false;
  }
  for (local_2c = 0; local_2c < this->tabs; local_2c = local_2c + 1) {
    std::operator<<(this->out,'\t');
  }
  poVar1 = std::operator<<(this->out,'\"');
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,'\"');
  std::operator<<(poVar1,": ");
  save(this->out,t,this->tabs);
  uVar2 = std::ios::fail();
  return (uVar2 & 1) == 0;
}

Assistant:

bool process(const char* name, T& t) {
		if (first)
			first = false;
		else
			out << ",\n";
		for (int i = 0; i < tabs; ++i) out << '\t';
		out << quote << name << quote << ": ";
		save(out, t, tabs);
		if (out.fail())
			return false;
		return true;
	}